

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalReadFrame(Wal *pWal,u32 iRead,int nOut,u8 *pOut)

{
  uint uVar1;
  int iVar2;
  int local_44;
  i64 iOffset;
  int sz;
  u8 *pOut_local;
  int nOut_local;
  u32 iRead_local;
  Wal *pWal_local;
  
  uVar1 = (uint)(pWal->hdr).szPage;
  iVar2 = (uVar1 & 0xfe00) + (uVar1 & 1) * 0x10000;
  local_44 = nOut;
  if (iVar2 < nOut) {
    local_44 = iVar2;
  }
  iVar2 = sqlite3OsRead(pWal->pWalFd,pOut,local_44,(ulong)(iRead - 1) * (long)(iVar2 + 0x18) + 0x38)
  ;
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalReadFrame(
  Wal *pWal,                      /* WAL handle */
  u32 iRead,                      /* Frame to read */
  int nOut,                       /* Size of buffer pOut in bytes */
  u8 *pOut                        /* Buffer to write page data to */
){
  int sz;
  i64 iOffset;
  sz = pWal->hdr.szPage;
  sz = (sz&0xfe00) + ((sz&0x0001)<<16);
  testcase( sz<=32768 );
  testcase( sz>=65536 );
  iOffset = walFrameOffset(iRead, sz) + WAL_FRAME_HDRSIZE;
  /* testcase( IS_BIG_INT(iOffset) ); // requires a 4GiB WAL */
  return sqlite3OsRead(pWal->pWalFd, pOut, (nOut>sz ? sz : nOut), iOffset);
}